

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O2

void __thiscall
Json::BuiltStyledStreamWriter::writeValue(BuiltStyledStreamWriter *this,Value *value)

{
  bool bVar1;
  ValueType VVar2;
  Json *pJVar3;
  Value *root;
  bool value_00;
  LargestUInt value_01;
  LargestInt value_02;
  PrecisionType in_R8D;
  pointer key;
  double value_03;
  char *end;
  char *str;
  String SStack_78;
  allocator<char> local_51;
  char *local_50;
  Members local_48;
  
  VVar2 = Value::type(value);
  switch(VVar2) {
  case nullValue:
    pushValue(this,&this->nullSymbol_);
    return;
  case intValue:
    pJVar3 = (Json *)Value::asLargestInt(value);
    valueToString_abi_cxx11_(&SStack_78,pJVar3,value_02);
    pushValue(this,&SStack_78);
    break;
  case uintValue:
    pJVar3 = (Json *)Value::asLargestUInt(value);
    valueToString_abi_cxx11_(&SStack_78,pJVar3,value_01);
    pushValue(this,&SStack_78);
    break;
  case realValue:
    value_03 = Value::asDouble(value);
    (anonymous_namespace)::valueToString_abi_cxx11_
              (&SStack_78,(_anonymous_namespace_ *)(ulong)((this->field_0xd8 & 4) >> 2),value_03,
               SUB41(this->precision_,0),this->precisionType_,in_R8D);
    pushValue(this,&SStack_78);
    break;
  case stringValue:
    bVar1 = Value::getString(value,(char **)&local_48,&local_50);
    if (bVar1) {
      valueToQuotedStringN_abi_cxx11_
                (&SStack_78,
                 (Json *)local_48.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                 local_50 +
                 -(long)local_48.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                 (ulong)((this->field_0xd8 & 8) >> 3),SUB41(in_R8D,0));
      pushValue(this,&SStack_78);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&SStack_78,"",&local_51);
      pushValue(this,&SStack_78);
    }
    break;
  case booleanValue:
    bVar1 = Value::asBool(value);
    valueToString_abi_cxx11_(&SStack_78,(Json *)(ulong)bVar1,value_00);
    pushValue(this,&SStack_78);
    break;
  case arrayValue:
    writeArrayValue(this,value);
    return;
  case objectValue:
    Value::getMemberNames_abi_cxx11_(&local_48,value);
    if (local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&SStack_78,"{}",(allocator<char> *)&local_50);
      pushValue(this,&SStack_78);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&SStack_78,"{",(allocator<char> *)&local_50);
      writeWithIndent(this,&SStack_78);
      std::__cxx11::string::~string((string *)&SStack_78);
      indent(this);
      key = local_48.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      while( true ) {
        root = Value::operator[](value,key);
        writeCommentBeforeValue(this,root);
        valueToQuotedStringN_abi_cxx11_
                  (&SStack_78,(Json *)(key->_M_dataplus)._M_p,(char *)key->_M_string_length,
                   (ulong)((this->field_0xd8 & 8) >> 3),SUB41(in_R8D,0));
        writeWithIndent(this,&SStack_78);
        std::__cxx11::string::~string((string *)&SStack_78);
        std::operator<<((this->super_StreamWriter).sout_,(string *)&this->colonSymbol_);
        writeValue(this,root);
        key = key + 1;
        if (key == local_48.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) break;
        std::operator<<((this->super_StreamWriter).sout_,",");
        writeCommentAfterValueOnSameLine(this,root);
      }
      writeCommentAfterValueOnSameLine(this,root);
      unindent(this);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&SStack_78,"}",(allocator<char> *)&local_50);
      writeWithIndent(this,&SStack_78);
    }
    std::__cxx11::string::~string((string *)&SStack_78);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
  default:
    goto switchD_007049a9_default;
  }
  std::__cxx11::string::~string((string *)&SStack_78);
switchD_007049a9_default:
  return;
}

Assistant:

void BuiltStyledStreamWriter::writeValue(Value const& value) {
  switch (value.type()) {
  case nullValue:
    pushValue(nullSymbol_);
    break;
  case intValue:
    pushValue(valueToString(value.asLargestInt()));
    break;
  case uintValue:
    pushValue(valueToString(value.asLargestUInt()));
    break;
  case realValue:
    pushValue(valueToString(value.asDouble(), useSpecialFloats_, precision_,
                            precisionType_));
    break;
  case stringValue: {
    // Is NULL is possible for value.string_? No.
    char const* str;
    char const* end;
    bool ok = value.getString(&str, &end);
    if (ok)
      pushValue(
          valueToQuotedStringN(str, static_cast<size_t>(end - str), emitUTF8_));
    else
      pushValue("");
    break;
  }
  case booleanValue:
    pushValue(valueToString(value.asBool()));
    break;
  case arrayValue:
    writeArrayValue(value);
    break;
  case objectValue: {
    Value::Members members(value.getMemberNames());
    if (members.empty())
      pushValue("{}");
    else {
      writeWithIndent("{");
      indent();
      auto it = members.begin();
      for (;;) {
        String const& name = *it;
        Value const& childValue = value[name];
        writeCommentBeforeValue(childValue);
        writeWithIndent(
            valueToQuotedStringN(name.data(), name.length(), emitUTF8_));
        *sout_ << colonSymbol_;
        writeValue(childValue);
        if (++it == members.end()) {
          writeCommentAfterValueOnSameLine(childValue);
          break;
        }
        *sout_ << ",";
        writeCommentAfterValueOnSameLine(childValue);
      }
      unindent();
      writeWithIndent("}");
    }
  } break;
  }
}